

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterYs<unsigned_long_long>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLog>
::ShadedRenderer(ShadedRenderer<ImPlot::GetterYs<unsigned_long_long>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLog>
                 *this,GetterYs<unsigned_long_long> *getter1,GetterYRef *getter2,
                TransformerLinLog *transformer,ImU32 col)

{
  unsigned_long_long uVar1;
  double dVar2;
  ImVec2 IVar3;
  double dVar4;
  int iVar5;
  ImPlotPlot *pIVar6;
  GetterYRef *pGVar7;
  TransformerLinLog *pTVar8;
  ImVec2 IVar9;
  ImVec2 IVar10;
  double dVar11;
  double dVar12;
  ImPlotContext *pIVar13;
  int iVar14;
  
  this->Getter1 = getter1;
  this->Getter2 = getter2;
  this->Transformer = transformer;
  iVar5 = getter1->Count;
  iVar14 = getter2->Count;
  if (iVar5 < getter2->Count) {
    iVar14 = iVar5;
  }
  this->Prims = iVar14 + -1;
  this->Col = col;
  (this->P11).x = 0.0;
  (this->P11).y = 0.0;
  (this->P12).x = 0.0;
  pIVar13 = GImPlot;
  (this->P12).y = 0.0;
  dVar4 = getter1->X0;
  dVar12 = getter1->XScale;
  uVar1 = *(unsigned_long_long *)
           ((long)getter1->Ys +
           (long)((getter1->Offset % iVar5 + iVar5) % iVar5) * (long)getter1->Stride);
  dVar11 = log10((((double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                 GImPlot->CurrentPlot->YAxis[transformer->YAxis].Range.Min);
  iVar5 = transformer->YAxis;
  pIVar6 = pIVar13->CurrentPlot;
  dVar2 = pIVar6->YAxis[iVar5].Range.Min;
  IVar3 = pIVar13->PixelRange[iVar5].Min;
  IVar9.y = (float)(pIVar13->My[iVar5] *
                    ((dVar2 + (double)(float)(dVar11 / pIVar13->LogDenY[iVar5]) *
                              (pIVar6->YAxis[iVar5].Range.Max - dVar2)) - dVar2) + (double)IVar3.y);
  IVar9.x = (float)(pIVar13->Mx * ((dVar4 + dVar12 * 0.0) - (pIVar6->XAxis).Range.Min) +
                   (double)IVar3.x);
  this->P11 = IVar9;
  pIVar13 = GImPlot;
  pGVar7 = this->Getter2;
  pTVar8 = this->Transformer;
  dVar2 = pGVar7->XScale;
  dVar11 = pGVar7->X0;
  dVar12 = log10(pGVar7->YRef / GImPlot->CurrentPlot->YAxis[pTVar8->YAxis].Range.Min);
  iVar5 = pTVar8->YAxis;
  pIVar6 = pIVar13->CurrentPlot;
  dVar4 = pIVar6->YAxis[iVar5].Range.Min;
  IVar3 = pIVar13->PixelRange[iVar5].Min;
  IVar10.y = (float)(pIVar13->My[iVar5] *
                     ((dVar4 + (double)(float)(dVar12 / pIVar13->LogDenY[iVar5]) *
                               (pIVar6->YAxis[iVar5].Range.Max - dVar4)) - dVar4) + (double)IVar3.y)
  ;
  IVar10.x = (float)(pIVar13->Mx * ((dVar11 + dVar2 * 0.0) - (pIVar6->XAxis).Range.Min) +
                    (double)IVar3.x);
  this->P12 = IVar10;
  return;
}

Assistant:

ShadedRenderer(const TGetter1& getter1, const TGetter2& getter2, const TTransformer& transformer, ImU32 col) :
        Getter1(getter1),
        Getter2(getter2),
        Transformer(transformer),
        Prims(ImMin(Getter1.Count, Getter2.Count) - 1),
        Col(col)
    {
        P11 = Transformer(Getter1(0));
        P12 = Transformer(Getter2(0));
    }